

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cxx
# Opt level: O2

bool __thiscall cmsys::Directory::FileIsDirectory(Directory *this,size_t i)

{
  bool bVar1;
  string sStack_28;
  
  GetFilePath_abi_cxx11_(&sStack_28,this,i);
  bVar1 = SystemTools::FileIsDirectory(&sStack_28);
  std::__cxx11::string::~string((string *)&sStack_28);
  return bVar1;
}

Assistant:

bool Directory::FileIsDirectory(std::size_t i) const
{
#if defined(_WIN32) && !defined(__CYGWIN__)
  auto const& data = this->Internal->Files[i].FindData;
  return (data.dwFileAttributes & FILE_ATTRIBUTE_DIRECTORY) != 0;
#else
  std::string const& path = this->GetFilePath(i);
  return kwsys::SystemTools::FileIsDirectory(path);
#endif
}